

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteType(WatWriter *this,Type type,NextChar next_char)

{
  Type local_40;
  string local_38;
  
  local_40 = type;
  Type::GetName_abi_cxx11_(&local_38,&local_40);
  WritePuts(this,local_38._M_dataplus._M_p,next_char);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void WatWriter::WriteType(Type type, NextChar next_char) {
  WritePuts(type.GetName().c_str(), next_char);
}